

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O3

MockSupport * __thiscall MockSupport::getMockSupportScope(MockSupport *this,SimpleString *name)

{
  int iVar1;
  MockNamedValue *pMVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  MockSupport *pMVar6;
  undefined4 extraout_var;
  int in_ECX;
  void *__child_stack;
  void *in_R8;
  SimpleString mockingSupportName;
  SimpleString local_88;
  undefined1 local_78 [96];
  
  SimpleString::SimpleString(&local_88,"!!!$$$MockingSupportScope$$$!!!");
  SimpleString::operator+=(&local_88,name);
  pMVar2 = MockNamedValueList::getValueByName(&this->data_,&local_88);
  if (pMVar2 == (MockNamedValue *)0x0) {
    iVar1 = clone(this,(__fn *)name,__child_stack,in_ECX,in_R8);
    pMVar6 = (MockSupport *)CONCAT44(extraout_var,iVar1);
    SimpleString::SimpleString((SimpleString *)(local_78 + 0x10),"MockSupport");
    pMVar2 = retrieveDataFromStore(this,&local_88);
    (*pMVar2->_vptr_MockNamedValue[0x11])(pMVar2,local_78 + 0x10,pMVar6);
    SimpleString::~SimpleString((SimpleString *)(local_78 + 0x10));
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    getData((MockNamedValue *)(local_78 + 0x10),this,&local_88);
    MockNamedValue::getType((MockNamedValue *)local_78);
    pcVar4 = SimpleString::asCharString((SimpleString *)local_78);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar3->_vptr_UtestShell[9])
              (pUVar3,"MockSupport",pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockSupport.cpp"
               ,0x1c6,pTVar5);
    SimpleString::~SimpleString((SimpleString *)local_78);
    MockNamedValue::~MockNamedValue((MockNamedValue *)(local_78 + 0x10));
    getData((MockNamedValue *)(local_78 + 0x10),this,&local_88);
    pMVar6 = (MockSupport *)MockNamedValue::getObjectPointer((MockNamedValue *)(local_78 + 0x10));
    MockNamedValue::~MockNamedValue((MockNamedValue *)(local_78 + 0x10));
  }
  SimpleString::~SimpleString(&local_88);
  return pMVar6;
}

Assistant:

MockSupport* MockSupport::getMockSupportScope(const SimpleString& name)
{
    SimpleString mockingSupportName = MOCK_SUPPORT_SCOPE_PREFIX;
    mockingSupportName += name;

    if (hasData(mockingSupportName)) {
        STRCMP_EQUAL("MockSupport", getData(mockingSupportName).getType().asCharString());
        return (MockSupport*) getData(mockingSupportName).getObjectPointer();
    }

    MockSupport *newMock = clone(name);

    setDataObject(mockingSupportName, "MockSupport", newMock);
    return newMock;
}